

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

ly_bool set_values_equal_cb(void *val1_p,void *val2_p,ly_bool UNUSED_mod,void *UNUSED_cb_data)

{
  lyxp_set_hash_node *val2;
  lyxp_set_hash_node *val1;
  void *UNUSED_cb_data_local;
  ly_bool UNUSED_mod_local;
  void *val2_p_local;
  void *val1_p_local;
  
  if ((*val1_p == *val2_p) && (*(int *)((long)val1_p + 8) == *(int *)((long)val2_p + 8))) {
    val1_p_local._7_1_ = '\x01';
  }
  else {
    val1_p_local._7_1_ = '\0';
  }
  return val1_p_local._7_1_;
}

Assistant:

static ly_bool
set_values_equal_cb(void *val1_p, void *val2_p, ly_bool UNUSED(mod), void *UNUSED(cb_data))
{
    struct lyxp_set_hash_node *val1, *val2;

    val1 = (struct lyxp_set_hash_node *)val1_p;
    val2 = (struct lyxp_set_hash_node *)val2_p;

    if ((val1->node == val2->node) && (val1->type == val2->type)) {
        return 1;
    }

    return 0;
}